

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O0

lzma_outbuf * lzma_outq_get_buf(lzma_outq *outq)

{
  uint32_t uVar1;
  lzma_outbuf *plVar2;
  lzma_outbuf *buf;
  lzma_outq *outq_local;
  
  if (outq->bufs_used < outq->bufs_allocated) {
    plVar2 = outq->bufs + outq->bufs_pos;
    plVar2->buf = outq->bufs_mem + (ulong)outq->bufs_pos * outq->buf_size_max;
    plVar2->size = 0;
    plVar2->finished = false;
    uVar1 = outq->bufs_pos + 1;
    outq->bufs_pos = uVar1;
    if (uVar1 == outq->bufs_allocated) {
      outq->bufs_pos = 0;
    }
    outq->bufs_used = outq->bufs_used + 1;
    return plVar2;
  }
  __assert_fail("outq->bufs_used < outq->bufs_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/outqueue.c"
                ,0x75,"lzma_outbuf *lzma_outq_get_buf(lzma_outq *)");
}

Assistant:

extern lzma_outbuf *
lzma_outq_get_buf(lzma_outq *outq)
{
	// Caller must have checked it with lzma_outq_has_buf().
	assert(outq->bufs_used < outq->bufs_allocated);

	// Initialize the new buffer.
	lzma_outbuf *buf = &outq->bufs[outq->bufs_pos];
	buf->buf = outq->bufs_mem + outq->bufs_pos * outq->buf_size_max;
	buf->size = 0;
	buf->finished = false;

	// Update the queue state.
	if (++outq->bufs_pos == outq->bufs_allocated)
		outq->bufs_pos = 0;

	++outq->bufs_used;

	return buf;
}